

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key,Symbol **value)

{
  Type *pTVar1;
  long lVar2;
  Type pHVar3;
  Type piVar4;
  code *pcVar5;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar6;
  bool bVar7;
  hash_t hVar8;
  int iVar9;
  ulong uVar10;
  Symbol **ppSVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  CharacterBuffer<char16_t> local_70;
  CharacterBuffer<char16_t> *local_60;
  Symbol **local_58;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *local_50;
  uint local_44;
  undefined4 *local_40;
  hash_t local_34;
  
  lVar14 = *(long *)this;
  local_58 = value;
  if (lVar14 == 0) {
    BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  local_60 = key;
  local_34 = GetHashCodeWithKey<JsUtil::CharacterBuffer<char16_t>>(key);
  local_44 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                          *)this,local_34);
  lVar2 = *(long *)(this + 8);
  uVar10 = (ulong)local_44;
  uVar12 = 0;
  local_50 = (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
              *)this;
  local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (ppSVar11 = (Symbol **)(lVar14 + uVar10 * 4); this_00 = local_50, -1 < (long)*(int *)ppSVar11;
      ppSVar11 = ppSVar11 + 1) {
    lVar14 = (long)*(int *)ppSVar11 * 0x10;
    ppSVar11 = (Symbol **)(lVar14 + lVar2);
    ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*>::ToKey
              ((ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)&local_70,ppSVar11);
    hVar8 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_70);
    hVar8 = hVar8 * 2 + 1;
    if (hVar8 != *(hash_t *)(lVar2 + 0xc + lVar14)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = local_40;
      *local_40 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                         ,199,
                         "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                         ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
      if (!bVar7) goto LAB_007db2e3;
      *puVar6 = 0;
      hVar8 = *(hash_t *)((long)ppSVar11 + 0xc);
    }
    if (hVar8 == local_34) {
      ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*>::ToKey
                ((ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)&local_70,ppSVar11);
      bVar7 = CharacterBuffer<char16_t>::operator==(&local_70,local_60);
      if (bVar7) {
        if (local_50->stats == (DictionaryStats *)0x0) {
          return -1;
        }
        DictionaryStats::Lookup(local_50->stats,uVar12);
        return -1;
      }
    }
    uVar12 = uVar12 + 1;
  }
  if (local_50->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_50->stats,uVar12);
  }
  puVar6 = local_40;
  uVar12 = local_44;
  if (this_00->freeCount == 0) {
    iVar9 = this_00->size;
    iVar13 = this_00->count;
    if (iVar13 == iVar9) {
      BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
      ::Resize(this_00);
      uVar12 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
               ::GetBucket(this_00,local_34);
      iVar9 = this_00->size;
      iVar13 = this_00->count;
    }
    this_00->count = iVar13 + 1;
    if (iVar9 < iVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar7) goto LAB_007db2e3;
      *puVar6 = 0;
      iVar9 = this_00->size;
    }
    if (iVar9 <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar7) goto LAB_007db2e3;
      *puVar6 = 0;
    }
  }
  else {
    if (this_00->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar7) goto LAB_007db2e3;
      *puVar6 = 0;
    }
    iVar13 = this_00->freeList;
    if (iVar13 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar7) goto LAB_007db2e3;
      *puVar6 = 0;
      iVar13 = this_00->freeList;
    }
    if (this_00->count <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar7) {
LAB_007db2e3:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar6 = 0;
      iVar13 = this_00->freeList;
    }
    pTVar1 = &this_00->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar9 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex(this_00->entries + iVar13);
      this_00->freeList = iVar9;
    }
  }
  pHVar3 = this_00->entries;
  *(Symbol **)
   &pHVar3[iVar13].
    super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
       = *local_58;
  pHVar3[iVar13].
  super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .hashCode = local_34;
  piVar4 = this_00->buckets;
  *(int *)&pHVar3[iVar13].
           super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
           .field_0x8 = piVar4[uVar12];
  piVar4[uVar12] = iVar13;
  uVar12 = 0;
  iVar9 = iVar13;
  do {
    iVar9 = *(int *)&pHVar3[iVar9].
                     super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                     .field_0x8;
    uVar12 = uVar12 + 1;
  } while (iVar9 != -1);
  if (this_00->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this_00->stats,uVar12);
  }
  return iVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }